

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O2

bool __thiscall
cmFortranParser_s::FindIncludeFile
          (cmFortranParser_s *this,char *dir,char *includeName,string *fileName)

{
  pointer pbVar1;
  bool bVar2;
  pointer pbVar3;
  allocator<char> local_59;
  string *local_58;
  string fullName;
  
  bVar2 = cmsys::SystemTools::FileIsFullPath(includeName);
  if (bVar2) {
    std::__cxx11::string::assign((char *)fileName);
    bVar2 = cmsys::SystemTools::FileExists(fileName,true);
    return bVar2;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&fullName,dir,&local_59);
  std::__cxx11::string::append((char *)&fullName);
  std::__cxx11::string::append((char *)&fullName);
  bVar2 = cmsys::SystemTools::FileExists(&fullName,true);
  if (bVar2) {
    bVar2 = true;
    std::__cxx11::string::_M_assign((string *)fileName);
  }
  else {
    pbVar3 = (this->IncludePath).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->IncludePath).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_58 = fileName;
    do {
      if (pbVar3 == pbVar1) {
        bVar2 = false;
        goto LAB_00296a2c;
      }
      std::__cxx11::string::_M_assign((string *)&fullName);
      std::__cxx11::string::append((char *)&fullName);
      std::__cxx11::string::append((char *)&fullName);
      bVar2 = cmsys::SystemTools::FileExists(&fullName,true);
      pbVar3 = pbVar3 + 1;
    } while (!bVar2);
    bVar2 = true;
    std::__cxx11::string::_M_assign((string *)local_58);
  }
LAB_00296a2c:
  std::__cxx11::string::~string((string *)&fullName);
  return bVar2;
}

Assistant:

bool cmFortranParser_s::FindIncludeFile(const char* dir,
                                        const char* includeName,
                                        std::string& fileName)
{
  // If the file is a full path, include it directly.
  if (cmSystemTools::FileIsFullPath(includeName)) {
    fileName = includeName;
    return cmSystemTools::FileExists(fileName, true);
  }
  // Check for the file in the directory containing the including
  // file.
  std::string fullName = dir;
  fullName += "/";
  fullName += includeName;
  if (cmSystemTools::FileExists(fullName, true)) {
    fileName = fullName;
    return true;
  }

  // Search the include path for the file.
  for (std::string const& i : this->IncludePath) {
    fullName = i;
    fullName += "/";
    fullName += includeName;
    if (cmSystemTools::FileExists(fullName, true)) {
      fileName = fullName;
      return true;
    }
  }
  return false;
}